

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O2

void __thiscall
helics::Translator::setOperator(Translator *this,shared_ptr<helics::TranslatorOperator> *operation)

{
  shared_ptr<helics::TranslatorOperations> *psVar1;
  shared_ptr<helics::TranslatorOperations> local_48;
  shared_ptr<helics::TranslatorOperations> local_38;
  shared_ptr<helics::TranslatorOperations> local_28;
  
  if ((operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    local_48.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    setTranslatorOperations(this,&local_48);
    psVar1 = &local_48;
  }
  else {
    std::make_shared<helics::CustomTranslatorOperation,std::shared_ptr<helics::TranslatorOperator>>
              ((shared_ptr<helics::TranslatorOperator> *)&local_38);
    psVar1 = &local_38;
    local_28.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_28.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    setTranslatorOperations(this,&local_28);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_28.
                super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(psVar1->super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount);
  return;
}

Assistant:

void Translator::setOperator(std::shared_ptr<TranslatorOperator> operation)
{
    if (operation) {
        setTranslatorOperations(std::make_shared<CustomTranslatorOperation>(std::move(operation)));
    } else {
        setTranslatorOperations(nullptr);
    }
}